

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LSM_tree.cpp
# Opt level: O3

bool __thiscall LSM_tree::del(LSM_tree *this,uint64_t key)

{
  bool bVar1;
  string s;
  string local_40;
  
  bVar1 = find(this,key);
  if (bVar1) {
    local_40._M_string_length = 0;
    local_40.field_2._M_local_buf[0] = '\0';
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    put(this,key,&local_40,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,
                      CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                               local_40.field_2._M_local_buf[0]) + 1);
    }
  }
  return bVar1;
}

Assistant:

bool LSM_tree::del(uint64_t key) {
    //这个find是找 确实有没有这个 如果memtable有key 但标为被删就算没找到
    //如果要去文件里找看最大时间码的有没有标记未被删了的
    //cout<<"del"<<key<<endl;
    if (!find(key)) return false;
    std::string s;
    put(key, s, true);
    return true;
}